

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

djg_mesh * djgm__create(void)

{
  djg_mesh *pdVar1;
  djg_mesh *mesh;
  
  pdVar1 = (djg_mesh *)malloc(0x28);
  if (pdVar1 != (djg_mesh *)0x0) {
    pdVar1->vertexv = (djgm_vertex *)0x0;
    pdVar1->poly3v = (uint16_t *)0x0;
    pdVar1->poly4v = (uint16_t *)0x0;
    pdVar1->vertexc = 0;
    pdVar1->poly3c = 0;
    pdVar1->poly4c = 0;
    return pdVar1;
  }
  __assert_fail("mesh",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                ,0x5fc,"djg_mesh *djgm__create()");
}

Assistant:

static djg_mesh *djgm__create(void)
{
    djg_mesh *mesh = (djg_mesh *)DJG_MALLOC(sizeof(*mesh));

    DJG_ASSERT(mesh);
    mesh->vertexv = NULL;
    mesh->poly3v = NULL;
    mesh->poly4v = NULL;
    mesh->vertexc = 0;
    mesh->poly3c = 0;
    mesh->poly4c = 0;

    return mesh;
}